

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightBounds * pbrt::Union(LightBounds *__return_storage_ptr__,LightBounds *a,LightBounds *b)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  bool bVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  DirectionCone cone;
  DirectionCone local_68;
  DirectionCone local_50;
  DirectionCone local_38;
  
  if ((a->phi != 0.0) || (NAN(a->phi))) {
    if ((b->phi != 0.0) || (NAN(b->phi))) {
      uVar6._0_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar6._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar6;
      local_50.w.super_Tuple3<pbrt::Vector3,_float>.z = (a->w).super_Tuple3<pbrt::Vector3,_float>.z;
      local_50.cosTheta = a->cosTheta_o;
      auVar27._0_4_ = (float)(undefined4)uVar6 * (float)(undefined4)uVar6;
      auVar27._4_4_ = (float)uVar6._4_4_ * (float)uVar6._4_4_;
      auVar27._8_8_ = 0;
      auVar25 = vhaddps_avx(auVar27,auVar27);
      auVar25 = ZEXT416((uint)(local_50.w.super_Tuple3<pbrt::Vector3,_float>.z *
                               local_50.w.super_Tuple3<pbrt::Vector3,_float>.z + auVar25._0_4_));
      auVar25 = vsqrtss_avx(auVar25,auVar25);
      fVar24 = auVar25._0_4_;
      auVar31._4_4_ = fVar24;
      auVar31._0_4_ = fVar24;
      auVar31._8_4_ = fVar24;
      auVar31._12_4_ = fVar24;
      local_50.w.super_Tuple3<pbrt::Vector3,_float>.z =
           local_50.w.super_Tuple3<pbrt::Vector3,_float>.z / fVar24;
      auVar25 = vdivps_avx(auVar15,auVar31);
      local_50.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar25);
      local_50.empty = false;
      uVar7._0_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar7._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar7;
      local_68.w.super_Tuple3<pbrt::Vector3,_float>.z = (b->w).super_Tuple3<pbrt::Vector3,_float>.z;
      local_68.cosTheta = b->cosTheta_o;
      auVar25._0_4_ = (float)(undefined4)uVar7 * (float)(undefined4)uVar7;
      auVar25._4_4_ = (float)uVar7._4_4_ * (float)uVar7._4_4_;
      auVar25._8_8_ = 0;
      auVar25 = vhaddps_avx(auVar25,auVar25);
      auVar25 = ZEXT416((uint)(local_68.w.super_Tuple3<pbrt::Vector3,_float>.z *
                               local_68.w.super_Tuple3<pbrt::Vector3,_float>.z + auVar25._0_4_));
      auVar25 = vsqrtss_avx(auVar25,auVar25);
      fVar24 = auVar25._0_4_;
      auVar32._4_4_ = fVar24;
      auVar32._0_4_ = fVar24;
      auVar32._8_4_ = fVar24;
      auVar32._12_4_ = fVar24;
      local_68.w.super_Tuple3<pbrt::Vector3,_float>.z =
           local_68.w.super_Tuple3<pbrt::Vector3,_float>.z / fVar24;
      auVar25 = vdivps_avx(auVar16,auVar32);
      local_68.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar25);
      local_68.empty = false;
      Union(&local_38,&local_50,&local_68);
      uVar2 = (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
      uVar8 = (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
      auVar26._4_4_ = uVar8;
      auVar26._0_4_ = uVar2;
      auVar26._8_8_ = 0;
      uVar3 = (a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
      uVar9 = (a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
      auVar28._4_4_ = uVar9;
      auVar28._0_4_ = uVar3;
      auVar28._8_8_ = 0;
      uVar4 = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
      uVar10 = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      auVar34._4_4_ = uVar10;
      auVar34._0_4_ = uVar4;
      auVar34._8_8_ = 0;
      fVar24 = a->phi;
      bVar12 = b->twoSided;
      auVar27 = vminss_avx(ZEXT416((uint)(b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z));
      auVar31 = vminss_avx(ZEXT416((uint)b->cosTheta_e),ZEXT416((uint)a->cosTheta_e));
      fVar1 = b->phi;
      bVar13 = a->twoSided;
      auVar16 = vminps_avx(auVar26,auVar28);
      uVar5 = (a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
      uVar11 = (a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      auVar29._4_4_ = uVar11;
      auVar29._0_4_ = uVar5;
      auVar29._8_8_ = 0;
      auVar25 = vmaxps_avx(auVar34,auVar29);
      auVar15 = vmaxss_avx(ZEXT416((uint)(b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z));
      uVar14 = vmovlps_avx(auVar16);
      (__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar14
      ;
      (__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar14 >> 0x20);
      (__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar27._0_4_;
      uVar14 = vmovlps_avx(auVar25);
      (__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar14
      ;
      (__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar14 >> 0x20);
      auVar30._8_8_ = 0;
      auVar30._0_4_ = local_38.w.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar30._4_4_ = local_38.w.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar33._0_4_ =
           local_38.w.super_Tuple3<pbrt::Vector3,_float>.x *
           local_38.w.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar33._4_4_ =
           local_38.w.super_Tuple3<pbrt::Vector3,_float>.y *
           local_38.w.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar33._8_8_ = 0;
      (__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar15._0_4_;
      __return_storage_ptr__->phi = fVar24 + fVar1;
      auVar25 = vhaddps_avx(auVar33,auVar33);
      auVar25 = ZEXT416((uint)(auVar25._0_4_ +
                              local_38.w.super_Tuple3<pbrt::Vector3,_float>.z *
                              local_38.w.super_Tuple3<pbrt::Vector3,_float>.z));
      auVar25 = vsqrtss_avx(auVar25,auVar25);
      fVar24 = auVar25._0_4_;
      auVar35._4_4_ = fVar24;
      auVar35._0_4_ = fVar24;
      auVar35._8_4_ = fVar24;
      auVar35._12_4_ = fVar24;
      auVar25 = vdivps_avx(auVar30,auVar35);
      uVar14 = vmovlps_avx(auVar25);
      (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar14;
      (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar14 >> 0x20);
      (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z =
           local_38.w.super_Tuple3<pbrt::Vector3,_float>.z / fVar24;
      __return_storage_ptr__->cosTheta_o = local_38.cosTheta;
      __return_storage_ptr__->cosTheta_e = auVar31._0_4_;
      __return_storage_ptr__->twoSided = (bool)(bVar12 | bVar13);
      return __return_storage_ptr__;
    }
    uVar14._0_4_ = (a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
    uVar14._4_4_ = (a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
    uVar17 = *(undefined8 *)&(a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
    uVar18._0_4_ = (a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
    uVar18._4_4_ = (a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar19._0_4_ = a->phi;
    uVar19._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar20 = *(undefined8 *)&(a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar21._0_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar21._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar22 = *(undefined8 *)&(a->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar23._0_4_ = a->cosTheta_e;
    uVar23._4_1_ = a->twoSided;
    uVar23._5_3_ = *(undefined3 *)&a->field_0x31;
  }
  else {
    uVar14._0_4_ = (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
    uVar14._4_4_ = (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
    uVar17 = *(undefined8 *)&(b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
    uVar18._0_4_ = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
    uVar18._4_4_ = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar19._0_4_ = b->phi;
    uVar19._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar20 = *(undefined8 *)&(b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar21._0_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar21._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar22 = *(undefined8 *)&(b->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar23._0_4_ = b->cosTheta_e;
    uVar23._4_1_ = b->twoSided;
    uVar23._5_3_ = *(undefined3 *)&b->field_0x31;
  }
  *(undefined8 *)&(__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar20
  ;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar21;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar21 >> 0x20);
  *(undefined8 *)&(__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = uVar22;
  __return_storage_ptr__->cosTheta_e = (Float)(int)uVar23;
  __return_storage_ptr__->twoSided = (bool)(char)((ulong)uVar23 >> 0x20);
  *(int3 *)&__return_storage_ptr__->field_0x31 = (int3)((ulong)uVar23 >> 0x28);
  (__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar14;
  (__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar14 >> 0x20);
  *(undefined8 *)&(__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar17
  ;
  (__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar18;
  (__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
       (float)(int)((ulong)uVar18 >> 0x20);
  __return_storage_ptr__->phi = (Float)(int)uVar19;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)uVar19 >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

LightBounds Union(const LightBounds &a, const LightBounds &b) {
    // If one _LightBounds_ has zero power, return the other
    if (a.phi == 0)
        return b;
    if (b.phi == 0)
        return a;

    // Find average direction and updated angles for _LightBounds_
    DirectionCone cone =
        Union(DirectionCone(a.w, a.cosTheta_o), DirectionCone(b.w, b.cosTheta_o));
    Float cosTheta_o = cone.cosTheta;
    Float cosTheta_e = std::min(a.cosTheta_e, b.cosTheta_e);

    // Return final _LightBounds_ union
    return LightBounds(Union(a.bounds, b.bounds), cone.w, a.phi + b.phi, cosTheta_o,
                       cosTheta_e, a.twoSided | b.twoSided);
}